

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

ZCC_Expression * __thiscall ZCCCompiler::SimplifyBinary(ZCCCompiler *this,ZCC_ExprBinary *binary)

{
  ZCC_Expression *pZVar1;
  ZCC_OpProto *pZVar2;
  ZCC_OpProto *op;
  ZCC_ExprBinary *binary_local;
  ZCCCompiler *this_local;
  
  pZVar1 = Simplify(this,binary->Left);
  binary->Left = pZVar1;
  pZVar1 = Simplify(this,binary->Right);
  binary->Right = pZVar1;
  pZVar2 = PromoteBinary(this,(binary->super_ZCC_Expression).Operation,&binary->Left,&binary->Right)
  ;
  this_local = (ZCCCompiler *)binary;
  if (pZVar2 == (ZCC_OpProto *)0x0) {
    (binary->super_ZCC_Expression).Type = &TypeError->super_PType;
  }
  else if ((binary->Left->Operation == PEX_ConstValue) &&
          (binary->Right->Operation == PEX_ConstValue)) {
    this_local = (ZCCCompiler *)(*(pZVar2->field_4).EvalConst1)((ZCC_ExprConstant *)binary->Left);
  }
  return (ZCC_Expression *)this_local;
}

Assistant:

ZCC_Expression *ZCCCompiler::SimplifyBinary(ZCC_ExprBinary *binary)
{
	binary->Left = Simplify(binary->Left);
	binary->Right = Simplify(binary->Right);
	ZCC_OpProto *op = PromoteBinary(binary->Operation, binary->Left, binary->Right);
	if (op == NULL)
	{
		binary->Type = TypeError;
	}
	else if (binary->Left->Operation == PEX_ConstValue &&
		binary->Right->Operation == PEX_ConstValue)
	{
		return op->EvalConst2(static_cast<ZCC_ExprConstant *>(binary->Left),
							  static_cast<ZCC_ExprConstant *>(binary->Right), AST.Strings);
	}
	return binary;
}